

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex_p.h
# Opt level: O0

void __thiscall
QGraphicsSceneIndexPrivate::items_helper
          (QGraphicsSceneIndexPrivate *this,QRectF *rect,QGraphicsSceneIndexIntersector intersect,
          QList<QGraphicsItem_*> *items,QTransform *viewTransform,ItemSelectionMode mode,
          SortOrder order,void *intersectData)

{
  long lVar1;
  QRectF exposeRect;
  QGraphicsSceneIndex *pQVar2;
  qsizetype qVar3;
  QList<QGraphicsItem_*> *in_RCX;
  qreal *in_RSI;
  QGraphicsSceneIndexPrivate *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int i_1;
  int n;
  int i;
  QGraphicsSceneIndex *q;
  undefined1 in_stack_00000088 [24];
  void *in_stack_000000a0;
  QList<QGraphicsItem_*> tli;
  qreal in_stack_ffffffffffffff38;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff40;
  QTransform *in_stack_ffffffffffffff48;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff50;
  int local_84;
  int local_7c;
  Data *intersect_00;
  QGraphicsItem *item;
  QGraphicsSceneIndexPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  intersect_00 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  item = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QGraphicsSceneIndexPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)pQVar2 + 0x98))(&stack0xffffffffffffffe0,pQVar2,in_RSI,0);
  for (local_7c = 0;
      qVar3 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)&stack0xffffffffffffffe0),
      local_7c < qVar3; local_7c = local_7c + 1) {
    QList<QGraphicsItem_*>::at(in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff38 = *in_RSI;
    in_stack_ffffffffffffff40 = (QList<QGraphicsItem_*> *)in_RSI[1];
    in_stack_ffffffffffffff48 = (QTransform *)in_RSI[2];
    in_stack_ffffffffffffff50 = (QList<QGraphicsItem_*> *)in_RSI[3];
    exposeRect._8_24_ = in_stack_00000088;
    exposeRect.xp = (qreal)this;
    recursive_items_helper
              (this_00,item,exposeRect,(QGraphicsSceneIndexIntersector)intersect_00,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (ItemSelectionMode)((ulong)in_stack_ffffffffffffff40 >> 0x20),
               in_stack_ffffffffffffff38,in_stack_000000a0);
  }
  if (in_stack_00000008 == 1) {
    qVar3 = QList<QGraphicsItem_*>::size(in_RCX);
    for (local_84 = 0; local_84 < (int)qVar3 / 2; local_84 = local_84 + 1) {
      QList<QGraphicsItem_*>::swapItemsAt
                (in_stack_ffffffffffffff50,(qsizetype)in_stack_ffffffffffffff48,
                 (qsizetype)in_stack_ffffffffffffff40);
    }
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa287aa);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QGraphicsSceneIndexPrivate::items_helper(const QRectF &rect, QGraphicsSceneIndexIntersector intersect,
                                                     QList<QGraphicsItem *> *items, const QTransform &viewTransform,
                                                     Qt::ItemSelectionMode mode, Qt::SortOrder order, const void *intersectData) const
{
    Q_Q(const QGraphicsSceneIndex);
    const QList<QGraphicsItem *> tli = q->estimateTopLevelItems(rect, Qt::AscendingOrder);
    for (int i = 0; i < tli.size(); ++i)
        recursive_items_helper(tli.at(i), rect, intersect, items, viewTransform, mode, 1.0, intersectData);
    if (order == Qt::DescendingOrder) {
        const int n = items->size();
        for (int i = 0; i < n / 2; ++i)
            items->swapItemsAt(i, n - i - 1);
    }
}